

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

KaxReferenceBlock * __thiscall libmatroska::KaxBlockGroup::Reference(KaxBlockGroup *this,uint Index)

{
  KaxReferenceBlock *local_20;
  KaxReferenceBlock *MyBlockAdds;
  uint Index_local;
  KaxBlockGroup *this_local;
  
  local_20 = (KaxReferenceBlock *)
             libebml::EbmlMaster::FindFirstElt
                       (&this->super_EbmlMaster,(EbmlCallbacks *)KaxReferenceBlock::ClassInfos);
  MyBlockAdds._4_4_ = Index;
  if (local_20 == (KaxReferenceBlock *)0x0) {
    __assert_fail("MyBlockAdds != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0x346,
                  "const KaxReferenceBlock &libmatroska::KaxBlockGroup::Reference(unsigned int) const"
                 );
  }
  while( true ) {
    if (MyBlockAdds._4_4_ == 0) {
      return local_20;
    }
    local_20 = (KaxReferenceBlock *)
               libebml::EbmlMaster::FindNextElt(&this->super_EbmlMaster,(EbmlElement *)local_20);
    if (local_20 == (KaxReferenceBlock *)0x0) break;
    MyBlockAdds._4_4_ = MyBlockAdds._4_4_ - 1;
  }
  __assert_fail("MyBlockAdds != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x34a,
                "const KaxReferenceBlock &libmatroska::KaxBlockGroup::Reference(unsigned int) const"
               );
}

Assistant:

const KaxReferenceBlock & KaxBlockGroup::Reference(unsigned int Index) const
{
  KaxReferenceBlock * MyBlockAdds = static_cast<KaxReferenceBlock *>(FindFirstElt(EBML_INFO(KaxReferenceBlock)));
  assert(MyBlockAdds != NULL); // call of a non existing reference

  while (Index != 0) {
    MyBlockAdds = static_cast<KaxReferenceBlock *>(FindNextElt(*MyBlockAdds));
    assert(MyBlockAdds != NULL);
    Index--;
  }
  return *MyBlockAdds;
}